

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall diligent_spirv_cross::Compiler::build_combined_image_samplers(Compiler *this)

{
  uint id;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  SPIRFunction *pSVar3;
  long lVar4;
  CombinedImageSamplerHandler handler;
  CombinedImageSamplerHandler CStack_d8;
  
  ParsedIR::create_loop_hard_lock(&this->ir);
  pTVar1 = (this->ir).ids_for_type[4].
           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->ir).ids_for_type[4].
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
          buffer_size;
  for (lVar4 = 0; sVar2 << 2 != lVar4; lVar4 = lVar4 + 4) {
    id = *(uint *)((long)&pTVar1->id + lVar4);
    if ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr[id].type == TypeFunction)
    {
      pSVar3 = ParsedIR::get<diligent_spirv_cross::SPIRFunction>(&this->ir,id);
      (pSVar3->combined_parameters).
      super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.
      buffer_size = 0;
      (pSVar3->shadow_arguments).super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>.
      buffer_size = 0;
      pSVar3->do_combined_parameters = true;
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&CStack_d8);
  (this->combined_image_samplers).super_VectorView<diligent_spirv_cross::CombinedImageSampler>.
  buffer_size = 0;
  CombinedImageSamplerHandler::CombinedImageSamplerHandler(&CStack_d8,this);
  pSVar3 = get<diligent_spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,pSVar3,&CStack_d8.super_OpcodeHandler);
  CombinedImageSamplerHandler::~CombinedImageSamplerHandler(&CStack_d8);
  return;
}

Assistant:

void Compiler::build_combined_image_samplers()
{
	ir.for_each_typed_id<SPIRFunction>([&](uint32_t, SPIRFunction &func) {
		func.combined_parameters.clear();
		func.shadow_arguments.clear();
		func.do_combined_parameters = true;
	});

	combined_image_samplers.clear();
	CombinedImageSamplerHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
}